

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O0

uint32_t predict_bandit_adf(warm_cb *data,multi_learner *base,example *ec)

{
  long lVar1;
  uint32_t uVar2;
  int iVar3;
  action_scores *a_s_00;
  undefined8 uVar4;
  long in_RDI;
  action_scores *a_s;
  stringstream __msg;
  uint32_t chosen_action;
  example *out_ec;
  uint32_t argmin;
  size_t in_stack_fffffffffffffdb0;
  vector<example_*,_std::allocator<example_*>_> *in_stack_fffffffffffffdb8;
  v_array<ACTION_SCORE::action_score> *dst;
  undefined4 in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffdd0;
  int plineNumber;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  undefined1 uVar5;
  vw_exception *in_stack_fffffffffffffde0;
  score_iterator *in_stack_fffffffffffffde8;
  uint64_t in_stack_fffffffffffffdf0;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffdf8;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffe00;
  example *in_stack_fffffffffffffe28;
  warm_cb *in_stack_fffffffffffffe30;
  uint32_t local_54;
  v_array<ACTION_SCORE::action_score> local_38;
  long local_8;
  
  plineNumber = (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
  dst = &local_38;
  local_8 = in_RDI;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  uVar2 = find_min<float>((vector<float,_std::allocator<float>_> *)dst);
  std::vector<float,_std::allocator<float>_>::~vector((vector<float,_std::allocator<float>_> *)dst);
  local_38.erase_count._4_4_ = uVar2;
  copy_example_to_adf(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::predict
            ((learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *)dst,
             in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  std::vector<example_*,_std::allocator<example_*>_>::operator[]
            ((vector<example_*,_std::allocator<example_*>_> *)(local_8 + 0x58),0);
  lVar1 = *(long *)(local_8 + 0x48);
  *(long *)(local_8 + 0x48) = lVar1 + 1;
  a_s_00 = (action_scores *)(*(long *)(local_8 + 0x20) + lVar1);
  ACTION_SCORE::begin_scores(a_s_00);
  ACTION_SCORE::end_scores(a_s_00);
  iVar3 = exploration::sample_after_normalizing<ACTION_SCORE::score_iterator>
                    (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                     (score_iterator *)in_stack_fffffffffffffde0,
                     (uint32_t *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
  if (iVar3 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe00);
    std::operator<<((ostream *)&stack0xfffffffffffffe10,"Failed to sample from pdf");
    uVar5 = 1;
    uVar4 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              (in_stack_fffffffffffffde0,(char *)CONCAT17(uVar5,in_stack_fffffffffffffdd8),
               plineNumber,(string *)CONCAT44(uVar2,in_stack_fffffffffffffdc8));
    __cxa_throw(uVar4,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  copy_array<ACTION_SCORE::action_score>(dst,a_s_00);
  return local_54;
}

Assistant:

uint32_t predict_bandit_adf(warm_cb& data, multi_learner& base, example& ec)
{
	uint32_t argmin = find_min(data.cumulative_costs);

  copy_example_to_adf(data, ec);
	base.predict(data.ecs, argmin);

	auto& out_ec = *data.ecs[0];
  uint32_t chosen_action;
  if (sample_after_normalizing(data.app_seed + data.example_counter++, begin_scores(out_ec.pred.a_s), end_scores(out_ec.pred.a_s), chosen_action))
    THROW("Failed to sample from pdf");

	auto& a_s = data.a_s_adf;
	copy_array<action_score>(a_s, out_ec.pred.a_s);

	return chosen_action;
}